

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_info.cpp
# Opt level: O1

unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true> __thiscall
duckdb::TransactionInfo::Copy(TransactionInfo *this)

{
  undefined1 uVar1;
  TransactionInfo *this_00;
  pointer pTVar2;
  pointer *__ptr;
  long in_RSI;
  
  this_00 = (TransactionInfo *)operator_new(0x10);
  TransactionInfo(this_00,*(TransactionType *)(in_RSI + 9));
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)this_00;
  uVar1 = *(undefined1 *)(in_RSI + 10);
  pTVar2 = unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>::
           operator->((unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
                       *)this);
  (pTVar2->super_ParseInfo).field_0xa = uVar1;
  return (unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>)
         (unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>)this;
}

Assistant:

unique_ptr<TransactionInfo> TransactionInfo::Copy() const {
	auto result = make_uniq<TransactionInfo>(type);
	result->modifier = modifier;
	return result;
}